

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O1

int Wlc_ManCountArithmReal(Wlc_Ntk_t *p,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  if ((long)vNodes->nSize < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      iVar1 = vNodes->pArray[lVar3];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      uVar4 = *(ushort *)(p->pObjs + iVar1) & 0x3f;
      if ((0x2d < uVar4) || (uVar5 = 1, (0x380000008000U >> uVar4 & 1) == 0)) {
        uVar5 = (uint)((short)uVar4 == 0x32);
      }
      iVar2 = iVar2 + uVar5;
      lVar3 = lVar3 + 1;
    } while (vNodes->nSize != lVar3);
  }
  return iVar2;
}

Assistant:

int Wlc_ManCountArithmReal( Wlc_Ntk_t * p, Vec_Int_t * vNodes )
{
    Wlc_Obj_t * pObj; 
    int i, Counter = 0;
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        Counter += Wlc_ObjIsArithmReal( pObj );
    return Counter;
}